

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

basic_appender<char>
fmt::v11::detail::write_ptr<char,fmt::v11::basic_appender<char>,unsigned_long>
          (basic_appender<char> out,unsigned_long value,format_specs *specs)

{
  basic_appender<char> bVar1;
  size_t sVar2;
  char *pcVar3;
  unsigned_long uVar4;
  ulong uVar5;
  buffer<char> *buf;
  ulong uVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  anon_class_16_2_92d121e5 write;
  char buffer [64];
  anon_class_16_2_92d121e5 local_68;
  char local_58 [64];
  
  uVar4 = value;
  lVar8 = 0;
  do {
    lVar7 = lVar8;
    lVar8 = lVar7 + 1;
    bVar9 = 0xf < uVar4;
    uVar4 = uVar4 >> 4;
  } while (bVar9);
  local_68.num_digits = (int)lVar8;
  local_68.value = value;
  if (specs == (format_specs *)0x0) {
    sVar2 = (out.container)->size_;
    uVar5 = (out.container)->capacity_;
    uVar6 = sVar2 + lVar8 + 2;
    if (uVar5 < uVar6) {
      (*(out.container)->grow_)(out.container,uVar6);
      sVar2 = (out.container)->size_;
      uVar5 = (out.container)->capacity_;
    }
    uVar6 = sVar2 + 1;
    if (uVar5 < uVar6) {
      (*(out.container)->grow_)(out.container,uVar6);
      sVar2 = (out.container)->size_;
      uVar6 = sVar2 + 1;
    }
    (out.container)->size_ = uVar6;
    (out.container)->ptr_[sVar2] = '0';
    sVar2 = (out.container)->size_;
    uVar5 = sVar2 + 1;
    if ((out.container)->capacity_ < uVar5) {
      (*(out.container)->grow_)(out.container,uVar5);
      sVar2 = (out.container)->size_;
      uVar5 = sVar2 + 1;
    }
    (out.container)->size_ = uVar5;
    (out.container)->ptr_[sVar2] = 'x';
    sVar2 = (out.container)->size_;
    uVar6 = (out.container)->capacity_;
    uVar5 = sVar2 + lVar8;
    if (uVar6 < uVar5) {
      (*(out.container)->grow_)(out.container,uVar5);
      sVar2 = (out.container)->size_;
      uVar6 = (out.container)->capacity_;
      uVar5 = sVar2 + lVar8;
    }
    if (uVar5 <= uVar6) {
      (out.container)->size_ = uVar5;
      if ((out.container)->ptr_ != (char *)0x0) {
        pcVar3 = (out.container)->ptr_ + lVar8 + sVar2;
        do {
          pcVar3 = pcVar3 + -1;
          *pcVar3 = "0123456789abcdef"[(uint)value & 0xf];
          bVar9 = 0xf < value;
          value = value >> 4;
        } while (bVar9);
        return (basic_appender<char>)out.container;
      }
    }
    pcVar3 = local_58 + lVar7;
    do {
      *pcVar3 = "0123456789abcdef"[(uint)value & 0xf];
      pcVar3 = pcVar3 + -1;
      bVar9 = 0xf < value;
      value = value >> 4;
    } while (bVar9);
    bVar1 = copy_noinline<char,char*,fmt::v11::basic_appender<char>>
                      (local_58,local_58 + lVar7 + 1,out);
  }
  else {
    bVar1 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::write_ptr<char,fmt::v11::basic_appender<char>,unsigned_long>(fmt::v11::basic_appender<char>,unsigned_long,fmt::v11::format_specs_const*)::_lambda(fmt::v11::basic_appender<char>)_1_&>
                      (out,specs,lVar7 + 3U,lVar7 + 3U,&local_68);
  }
  return (basic_appender<char>)bVar1.container;
}

Assistant:

auto write_ptr(OutputIt out, UIntPtr value, const format_specs* specs)
    -> OutputIt {
  int num_digits = count_digits<4>(value);
  auto size = to_unsigned(num_digits) + size_t(2);
  auto write = [=](reserve_iterator<OutputIt> it) {
    *it++ = static_cast<Char>('0');
    *it++ = static_cast<Char>('x');
    return format_base2e<Char>(4, it, value, num_digits);
  };
  return specs ? write_padded<Char, align::right>(out, *specs, size, write)
               : base_iterator(out, write(reserve(out, size)));
}